

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::V5::FixedFieldWithIDAndReason::readFrom
          (FixedFieldWithIDAndReason *this,uint8 *buffer,uint32 bufLength)

{
  uint32 uVar1;
  ushort uVar2;
  uint32 uVar3;
  
  uVar3 = 0xfffffffe;
  if (1 < bufLength) {
    uVar2 = *(ushort *)buffer;
    if (BigEndian(unsigned_short)::signature != '\x01') {
      if (BigEndian(unsigned_short)::signature == '\x04') {
        uVar2 = uVar2 << 8 | uVar2 >> 8;
      }
      else {
        uVar2 = 0;
      }
    }
    *(ushort *)&(this->super_FixedFieldWithRemainingLength).field_0x14 = uVar2;
    uVar1 = (this->super_FixedFieldWithRemainingLength).remLength;
    uVar3 = 0xfffffffd;
    if (uVar1 != 2) {
      ((this->_v).value)->reasonCode = buffer[2];
      uVar3 = 3;
      if (uVar1 == 3) {
        uVar3 = 0xfffffffd;
      }
    }
  }
  return uVar3;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    if (bufLength < 2) return NotEnoughData;
                    memcpy(&packetID, buffer, sizeof(packetID)); packetID = BigEndian(packetID);
                    if (remLength == 2) return Shortcut;
                    _v.value.reasonCode = buffer[2];
                    if (remLength == 3) return Shortcut; // No need to read properties here
                    return 3;
                }